

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

void make_heap(uint64_t **first,uint64_t len)

{
  uint64_t *value_00;
  ulong in_RSI;
  size_t in_RDI;
  uint64_t **unaff_retaddr;
  uint64_t *value;
  size_t parent;
  
  if (1 < in_RSI) {
    value_00 = (uint64_t *)(in_RSI - 2 >> 1);
    while (adjust_heap(unaff_retaddr,in_RDI,in_RSI,value_00), value_00 != (uint64_t *)0x0) {
      value_00 = (uint64_t *)((long)value_00 + -1);
    }
  }
  return;
}

Assistant:

static void
make_heap (uint64_t** first, uint64_t len)
{
    size_t parent;

    if (len < 2) return;
    parent = (len - 2) / 2;

    while (1)
    {
        uint64_t* value = *(first + parent);
        adjust_heap (first, parent, len, value);
        if (parent == 0) return;
        --parent;
    }
}